

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O3

int emulator_add_empty_breakpoint(void)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    bVar1 = s_breakpoints[lVar3].field_0x7;
    if ((bVar1 & 1) == 0) {
      iVar2 = (int)lVar3;
      s_breakpoints[lVar3].id = iVar2;
      s_breakpoints[lVar3].bank = '\0';
      s_breakpoints[lVar3].addr = 0;
      s_breakpoints[lVar3].field_0x7 = (bVar1 & 0xfc) + 1;
      if (s_breakpoint_max_id < iVar2 + 1) {
        s_breakpoint_max_id = iVar2 + 1;
      }
      s_breakpoint_count = s_breakpoint_count + 1;
      return iVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return -1;
}

Assistant:

int emulator_add_empty_breakpoint(void) {
  int id;
  for (id = 0; id < MAX_BREAKPOINTS; ++id) {
    Breakpoint* bp = &s_breakpoints[id];
    if (!bp->valid) {
      bp->id = id;
      bp->addr = bp->bank = 0;
      bp->enabled = FALSE;
      bp->valid = TRUE;
      s_breakpoint_max_id = MAX(id + 1, s_breakpoint_max_id);
      ++s_breakpoint_count;
      return id;
    }
  }
  return -1;
}